

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O1

bool __thiscall ProStringList::contains(ProStringList *this,char *str,CaseSensitivity cs)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  
  bVar5 = (this->super_QList<ProString>).d.size != 0;
  if ((bVar5) &&
     (iVar2 = ProString::compare((this->super_QList<ProString>).d.ptr,str,cs), iVar2 != 0)) {
    uVar4 = 0;
    lVar3 = 0x30;
    do {
      uVar4 = uVar4 + 1;
      uVar1 = (this->super_QList<ProString>).d.size;
      bVar5 = uVar4 < uVar1;
      if (uVar1 <= uVar4) {
        return bVar5;
      }
      iVar2 = ProString::compare((ProString *)
                                 ((long)&(((this->super_QList<ProString>).d.ptr)->m_string).d.d +
                                 lVar3),str,cs);
      lVar3 = lVar3 + 0x30;
    } while (iVar2 != 0);
  }
  return bVar5;
}

Assistant:

bool ProStringList::contains(const char *str, Qt::CaseSensitivity cs) const
{
    for (int i = 0; i < size(); i++)
        if (!at(i).compare(str, cs))
            return true;
    return false;
}